

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

void __thiscall
cpsm::
str_cat_impl<char_const*,char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
          (cpsm *this,stringstream *ss,char **x,char *args,
          basic_string_ref<char,_std::char_traits<char>_> args_1,char *args_2)

{
  char *args_1_00;
  char **local_30;
  
  args_1_00 = (char *)args_1.len_;
  local_30 = x;
  std::operator<<((ostream *)(this + 0x10),*(char **)ss);
  str_cat_impl<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
            (this,(stringstream *)&local_30,(char **)args,args_1,args_1_00);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}